

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

Result file_read_aligned(char *filename,size_t align,FileData *out_file_data)

{
  Result RVar1;
  char *__size;
  void *__ptr;
  size_t sVar2;
  u8 *data;
  long aligned_size;
  long size;
  FILE *f;
  FileData *out_file_data_local;
  size_t align_local;
  char *filename_local;
  
  f = (FILE *)out_file_data;
  out_file_data_local = (FileData *)align;
  align_local = (size_t)filename;
  size = (long)fopen(filename,"rb");
  if ((FILE *)size == (FILE *)0x0) {
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/common.c",0x2c);
    fprintf(_stderr,"unable to open file \"%s\".\n",align_local);
  }
  else {
    RVar1 = get_file_size((FILE *)size,&aligned_size);
    if (RVar1 == OK) {
      __size = (char *)((long)out_file_data_local + aligned_size + -1 &
                       ((ulong)((long)&out_file_data_local[-1].size + 7U) ^ 0xffffffffffffffff));
      __ptr = calloc(1,(size_t)__size);
      if (__ptr == (void *)0x0) {
        fprintf(_stderr,"%s:%d: ",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/common.c",0x31
               );
        fprintf(_stderr,"allocation failed.\n");
      }
      else {
        sVar2 = fread(__ptr,aligned_size,1,(FILE *)size);
        if (sVar2 == 1) {
          fclose((FILE *)size);
          *(void **)f = __ptr;
          f->_IO_read_ptr = __size;
          return OK;
        }
        fprintf(_stderr,"%s:%d: ",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/common.c",0x32
               );
        fprintf(_stderr,"fread failed.\n");
      }
    }
  }
  if (size != 0) {
    fclose((FILE *)size);
  }
  return ERROR;
}

Assistant:

Result file_read_aligned(const char* filename, size_t align,
                         FileData* out_file_data) {
  FILE* f = fopen(filename, "rb");
  CHECK_MSG(f, "unable to open file \"%s\".\n", filename);
  long size;
  CHECK(SUCCESS(get_file_size(f, &size)));
  long aligned_size = ALIGN_UP(size, align);
  u8* data = xcalloc(1, aligned_size);
  CHECK_MSG(data, "allocation failed.\n");
  CHECK_MSG(fread(data, size, 1, f) == 1, "fread failed.\n");
  fclose(f);
  out_file_data->data = data;
  out_file_data->size = aligned_size;
  return OK;
  ON_ERROR_CLOSE_FILE_AND_RETURN;
}